

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtWrenchesAndJointTorquesEstimator.cpp
# Opt level: O1

bool __thiscall
iDynTree::ExtWrenchesAndJointTorquesEstimator::estimateExtWrenchesAndJointTorques
          (ExtWrenchesAndJointTorquesEstimator *this,LinkUnknownWrenchContacts *unknowns,
          SensorsMeasurements *ftSensorsMeasures,LinkContactWrenches *estimateContactWrenches,
          JointDOFsDoubleArray *jointTorques)

{
  bool bVar1;
  char cVar2;
  SensorsList *sensors;
  VectorDynSize *pVVar3;
  char *pcVar4;
  
  if (this->m_isModelValid == false) {
    pcVar4 = "Model and sensors information not set.";
  }
  else if (this->m_isKinematicsUpdated == false) {
    pcVar4 = "Kinematic information not set.";
  }
  else {
    sensors = (SensorsList *)iDynTree::Model::sensors();
    bVar1 = estimateExternalWrenches
                      (&this->m_model,&this->m_submodels,sensors,unknowns,&this->m_jointPos,
                       &this->m_linkVels,&this->m_linkProperAccs,ftSensorsMeasures,&this->m_bufs,
                       estimateContactWrenches);
    if (bVar1) {
      cVar2 = iDynTree::LinkContactWrenches::computeNetWrenches
                        ((LinkWrenches *)estimateContactWrenches);
      if (cVar2 == '\0') {
        pcVar4 = "Error in computing the net external wrenches from the estimated contact forces";
      }
      else {
        cVar2 = iDynTree::RNEADynamicPhase
                          (&this->m_model,&this->m_dynamicTraversal,&this->m_jointPos,
                           &this->m_linkVels,&this->m_linkProperAccs,
                           &this->m_linkNetExternalWrenches,&this->m_linkIntWrenches,
                           &this->m_generalizedTorques);
        if (cVar2 != '\0') {
          pVVar3 = (VectorDynSize *)iDynTree::FreeFloatingGeneralizedTorques::jointTorques();
          iDynTree::VectorDynSize::operator=((VectorDynSize *)jointTorques,pVVar3);
          return true;
        }
        pcVar4 = "Error in computing the dynamic phase of the RNEA.";
      }
    }
    else {
      pcVar4 = "Error in estimating the external contact wrenches";
    }
  }
  iDynTree::reportError
            ("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",pcVar4);
  return false;
}

Assistant:

bool ExtWrenchesAndJointTorquesEstimator::estimateExtWrenchesAndJointTorques(const LinkUnknownWrenchContacts& unknowns,
                                                                             const SensorsMeasurements& ftSensorsMeasures,
                                                                                   LinkContactWrenches& estimateContactWrenches,
                                                                                   JointDOFsDoubleArray& jointTorques)
{
    if( !m_isModelValid )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Model and sensors information not set.");
        return false;
    }

    if( !m_isKinematicsUpdated )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Kinematic information not set.");
        return false;
    }

    /**
     * Compute external forces
     */
    bool ok = estimateExternalWrenches(m_model,m_submodels,m_model.sensors(),
                                       unknowns,m_jointPos,m_linkVels,m_linkProperAccs,
                                       ftSensorsMeasures,m_bufs,estimateContactWrenches);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Error in estimating the external contact wrenches");
        return false;
    }

    /**
     * Compute net external wrenches
     */
    ok = ok && estimateContactWrenches.computeNetWrenches(m_linkNetExternalWrenches);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Error in computing the net external wrenches from the estimated contact forces");
        return false;
    }

    /**
     * Compute joint torques
     */
    ok = ok && RNEADynamicPhase(m_model,m_dynamicTraversal,m_jointPos,m_linkVels,m_linkProperAccs,
                                m_linkNetExternalWrenches,m_linkIntWrenches,m_generalizedTorques);

    if( !ok )
    {
        reportError("ExtWrenchesAndJointTorquesEstimator","estimateExtWrenchesAndJointTorques",
                    "Error in computing the dynamic phase of the RNEA.");
        return false;
    }

    /**
     * Copy the joint torques computed by the RNEA to the output
     */
    jointTorques = m_generalizedTorques.jointTorques();

    return ok;
}